

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

void __thiscall DomBrush::clear(DomBrush *this)

{
  DomColor *this_00;
  void *pvVar1;
  long in_RDI;
  DomProperty *in_stack_00000080;
  DomGradient *this_01;
  
  this_00 = *(DomColor **)(in_RDI + 0x20);
  if (this_00 != (DomColor *)0x0) {
    DomColor::~DomColor(this_00);
    operator_delete(this_00,0x18);
  }
  this_01 = *(DomGradient **)(in_RDI + 0x28);
  if (this_01 != (DomGradient *)0x0) {
    DomProperty::~DomProperty(in_stack_00000080);
    operator_delete(this_01,0x178);
  }
  pvVar1 = *(void **)(in_RDI + 0x30);
  if (pvVar1 != (void *)0x0) {
    DomGradient::~DomGradient(this_01);
    operator_delete(pvVar1,0x118);
  }
  *(undefined4 *)(in_RDI + 0x1c) = 0;
  *(undefined8 *)(in_RDI + 0x20) = 0;
  *(undefined8 *)(in_RDI + 0x28) = 0;
  *(undefined8 *)(in_RDI + 0x30) = 0;
  return;
}

Assistant:

void DomBrush::clear()
{
    delete m_color;
    delete m_texture;
    delete m_gradient;

    m_kind = Unknown;

    m_color = nullptr;
    m_texture = nullptr;
    m_gradient = nullptr;
}